

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTInflateMap.cpp
# Opt level: O0

void __thiscall
TTD::TTDCompareMap::GetCompareValues
          (TTDCompareMap *this,TTDCompareTag compareTag,TTD_PTR_ID h1PtrId,uint64 *val1,
          TTD_PTR_ID h2PtrId,uint64 *val2)

{
  unsigned_long uVar1;
  uint64 *val2_local;
  TTD_PTR_ID h2PtrId_local;
  uint64 *val1_local;
  TTD_PTR_ID h1PtrId_local;
  TTDCompareMap *pTStack_10;
  TTDCompareTag compareTag_local;
  TTDCompareMap *this_local;
  
  val2_local = (uint64 *)h2PtrId;
  h2PtrId_local = (TTD_PTR_ID)val1;
  val1_local = (uint64 *)h1PtrId;
  h1PtrId_local._4_4_ = compareTag;
  pTStack_10 = this;
  if (compareTag == TopLevelLoadFunction) {
    uVar1 = JsUtil::
            BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::Item(&this->H1FunctionTopLevelLoadMap,(unsigned_long *)&val1_local);
    *(unsigned_long *)h2PtrId_local = uVar1;
    uVar1 = JsUtil::
            BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::Item(&this->H2FunctionTopLevelLoadMap,(unsigned_long *)&val2_local);
    *val2 = uVar1;
  }
  else if (compareTag == TopLevelNewFunction) {
    uVar1 = JsUtil::
            BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::Item(&this->H1FunctionTopLevelNewMap,(unsigned_long *)&val1_local);
    *(unsigned_long *)h2PtrId_local = uVar1;
    uVar1 = JsUtil::
            BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::Item(&this->H2FunctionTopLevelNewMap,(unsigned_long *)&val2_local);
    *val2 = uVar1;
  }
  else {
    if (compareTag != TopLevelEvalFunction) {
      TTDAbort_unrecoverable_error("Should be a type");
    }
    uVar1 = JsUtil::
            BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::Item(&this->H1FunctionTopLevelEvalMap,(unsigned_long *)&val1_local);
    *(unsigned_long *)h2PtrId_local = uVar1;
    uVar1 = JsUtil::
            BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::Item(&this->H2FunctionTopLevelEvalMap,(unsigned_long *)&val2_local);
    *val2 = uVar1;
  }
  return;
}

Assistant:

void TTDCompareMap::GetCompareValues(TTDCompareTag compareTag, TTD_PTR_ID h1PtrId, uint64* val1, TTD_PTR_ID h2PtrId, uint64* val2)
    {
        if(compareTag == TTDCompareTag::TopLevelLoadFunction)
        {
            *val1 = this->H1FunctionTopLevelLoadMap.Item(h1PtrId);
            *val2 = this->H2FunctionTopLevelLoadMap.Item(h2PtrId);
        }
        else if(compareTag == TTDCompareTag::TopLevelNewFunction)
        {
            *val1 = this->H1FunctionTopLevelNewMap.Item(h1PtrId);
            *val2 = this->H2FunctionTopLevelNewMap.Item(h2PtrId);
        }
        else
        {
            TTDAssert(compareTag == TTDCompareTag::TopLevelEvalFunction, "Should be a type");
            *val1 = this->H1FunctionTopLevelEvalMap.Item(h1PtrId);
            *val2 = this->H2FunctionTopLevelEvalMap.Item(h2PtrId);
        }
    }